

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O2

char * GetModuleMainName(Allocator *allocator,InplaceStr moduleName)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  uint i;
  ulong uVar3;
  uint uVar4;
  char *dst;
  
  uVar4 = (int)moduleName.end - (int)moduleName.begin;
  uVar1 = uVar4 + 8;
  iVar2 = (*allocator->_vptr_Allocator[2])(allocator,(ulong)uVar1);
  dst = (char *)CONCAT44(extraout_var,iVar2);
  NULLC::SafeSprintf(dst,(ulong)uVar1,"__init_%.*s",(ulong)uVar4,moduleName.begin);
  for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    if ((dst[uVar3] & 0xfeU) == 0x2e) {
      dst[uVar3] = '_';
    }
  }
  return dst;
}

Assistant:

const char* GetModuleMainName(Allocator *allocator, InplaceStr moduleName)
{
	unsigned length = unsigned(moduleName.length() + + strlen("__init_") + 1);
	char *targetName = (char*)allocator->alloc(length);

	NULLC::SafeSprintf(targetName, length, "__init_%.*s", FMT_ISTR(moduleName));

	for(unsigned i = 0; i < length; i++)
	{
		if(targetName[i] == '/' || targetName[i] == '.')
			targetName[i] = '_';
	}

	return targetName;
}